

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O3

Base_game * cpp_client::Game_registry::get_game(string *name)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  __node_base_ptr p_Var1;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar2;
  range_error *this_01;
  long *plVar3;
  long *plVar4;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this = &name_map_abi_cxx11_()->_M_h;
  p_Var1 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node(this,0,name,0);
  if ((p_Var1 != (__node_base_ptr)0x0) && (p_Var1->_M_nxt != (_Hash_node_base *)0x0)) {
    this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)name_map_abi_cxx11_();
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_00,name);
    return (pmVar2->_M_t).
           super___uniq_ptr_impl<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Base_game_*,_std::default_delete<cpp_client::Base_game>_>
           .super__Head_base<0UL,_cpp_client::Base_game_*,_false>._M_head_impl;
  }
  this_01 = (range_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"The requested game \"",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_60 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::range_error::range_error(this_01,(string *)&local_60);
  *(undefined ***)this_01 = &PTR__range_error_00139d38;
  __cxa_throw(this_01,&Game_not_found::typeinfo,std::range_error::~range_error);
}

Assistant:

Base_game& Game_registry::get_game(const std::string& name)
{
   if(name_map().count(name))
   {
      return *name_map()[name];
   }
   else
   {
      throw Game_not_found("The requested game \"" + name + "\" was not found.");
   }
}